

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messages.pb.cc
# Opt level: O2

void __thiscall Messages::AddressBook::MergeFrom(AddressBook *this,Message *from)

{
  LogMessage *pLVar1;
  LogFinisher local_51;
  LogMessage local_50 [56];
  
  if ((AddressBook *)from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SamuelXing[P]protobuf-over-tcpsocket-example/build_O2/proto/messages.pb.cc"
               ,0x3bf);
    pLVar1 = (LogMessage *)
             google::protobuf::internal::LogMessage::operator<<
                       (local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,pLVar1);
    google::protobuf::internal::LogMessage::~LogMessage(local_50);
  }
  if (*(undefined ***)from == &PTR__AddressBook_00110c58) {
    MergeFrom(this,(AddressBook *)from);
  }
  else {
    google::protobuf::internal::ReflectionOps::Merge(from,&this->super_Message);
  }
  return;
}

Assistant:

void AddressBook::MergeFrom(const ::PROTOBUF_NAMESPACE_ID::Message& from) {
// @@protoc_insertion_point(generalized_merge_from_start:Messages.AddressBook)
  GOOGLE_DCHECK_NE(&from, this);
  const AddressBook* source =
      ::PROTOBUF_NAMESPACE_ID::DynamicCastToGenerated<AddressBook>(
          &from);
  if (source == nullptr) {
  // @@protoc_insertion_point(generalized_merge_from_cast_fail:Messages.AddressBook)
    ::PROTOBUF_NAMESPACE_ID::internal::ReflectionOps::Merge(from, this);
  } else {
  // @@protoc_insertion_point(generalized_merge_from_cast_success:Messages.AddressBook)
    MergeFrom(*source);
  }
}